

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

void Super2_LibWriteGate(FILE *pFile,Super2_Lib_t *pLib,Super2_Gate_t *pGate)

{
  Super2_Lib_t *__stream;
  uint fInv_00;
  char *pcVar1;
  uint local_2c;
  uint local_24;
  int fInv;
  uint uTruth;
  Super2_Gate_t *pGate_local;
  Super2_Lib_t *pLib_local;
  FILE *pFile_local;
  
  fInv_00 = pGate->uTruth & pLib->uMaskBit;
  if (fInv_00 == 0) {
    local_2c = pGate->uTruth;
  }
  else {
    local_2c = pGate->uTruth ^ 0xffffffff;
  }
  local_24 = local_2c;
  _fInv = pGate;
  pGate_local = (Super2_Gate_t *)pLib;
  pLib_local = (Super2_Lib_t *)pFile;
  Extra_PrintBinary(pFile,&local_24,pLib->nMints);
  fprintf((FILE *)pLib_local,"   ");
  __stream = pLib_local;
  pcVar1 = Super2_LibWriteGate_rec(_fInv,fInv_00,*(int *)&pGate_local->pTwo);
  fprintf((FILE *)__stream,"%s",pcVar1);
  fprintf((FILE *)pLib_local,"\n");
  return;
}

Assistant:

void Super2_LibWriteGate( FILE * pFile, Super2_Lib_t * pLib, Super2_Gate_t * pGate )
{
//    unsigned uTruthR;
    unsigned uTruth;
    int fInv;

    // check whether the gate need complementation
    fInv = (int)(pGate->uTruth & pLib->uMaskBit);
    uTruth = (fInv? ~pGate->uTruth : pGate->uTruth);
/*
    // reverse the truth table
    uTruthR = 0;
    for ( m = 0; m < pLib->nMints; m++ )
        if ( uTruth & (1 << m) )
            uTruthR |= (1 << (pLib->nMints-1-m));
*/
    // write the truth table
    Extra_PrintBinary( pFile, &uTruth, pLib->nMints );
    fprintf( pFile, "   " );
    // write the symbolic expression
    fprintf( pFile, "%s", Super2_LibWriteGate_rec( pGate, fInv, pLib->nLevels ) );
    fprintf( pFile, "\n" );
}